

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

bool tinyxml2::XMLUtil::StringEqual(char *p,char *q,int nChar)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  
  bVar1 = true;
  if (p != q) {
    lVar3 = 0;
    while( true ) {
      iVar2 = (int)lVar3;
      if (p[lVar3] == '\0') break;
      if ((p[lVar3] != q[lVar3]) || (nChar <= iVar2)) {
        if (nChar == iVar2) {
          return true;
        }
        goto LAB_00194b25;
      }
      lVar3 = lVar3 + 1;
    }
    if ((nChar != iVar2) && (q[lVar3] != '\0')) {
LAB_00194b25:
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

inline static bool StringEqual( const char* p, const char* q, int nChar=INT_MAX )  {
        if ( p == q ) {
            return true;
        }
        int n = 0;
        while( *p && *q && *p == *q && n<nChar ) {
            ++p;
            ++q;
            ++n;
        }
        if ( (n == nChar) || ( *p == 0 && *q == 0 ) ) {
            return true;
        }
        return false;
    }